

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

ServiceOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::ServiceOptions>
          (Tables *this,ServiceOptions *dummy)

{
  ServiceOptions *this_00;
  ServiceOptions *local_18;
  
  this_00 = (ServiceOptions *)operator_new(0x60);
  ServiceOptions::ServiceOptions(this_00);
  local_18 = this_00;
  std::vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>::
  emplace_back<google::protobuf::Message*>
            ((vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>> *)
             &this->messages_,(Message **)&local_18);
  return this_00;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* dummy) {
  Type* result = new Type;
  messages_.push_back(result);
  return result;
}